

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O3

void VP8InitBitReader(VP8BitReader *br,uint8_t *start,size_t size)

{
  ulong uVar1;
  byte *pbVar2;
  ulong *puVar3;
  
  br->range = 0xfe;
  br->bits = -8;
  br->value = 0;
  br->eof = 0;
  if (start == (uint8_t *)0x0) {
    start = br->buf;
    puVar3 = (ulong *)br->buf_max;
  }
  else {
    br->buf = start;
    br->buf_end = start + size;
    puVar3 = (ulong *)(start + (size - 7));
    if (size < 8) {
      puVar3 = (ulong *)start;
    }
    br->buf_max = (uint8_t *)puVar3;
  }
  if (start < puVar3) {
    uVar1 = *(ulong *)start;
    br->buf = (uint8_t *)((long)start + 7);
    br->value = ((uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
                 (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 |
                 (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38) >> 8;
    br->bits = 0x30;
    return;
  }
  pbVar2 = br->buf;
  if (pbVar2 < br->buf_end) {
    br->bits = br->bits + 8;
    br->buf = pbVar2 + 1;
    br->value = br->value << 8 | (ulong)*pbVar2;
    return;
  }
  if (br->eof != 0) {
    br->bits = 0;
    return;
  }
  br->value = br->value << 8;
  br->bits = br->bits + 8;
  br->eof = 1;
  return;
}

Assistant:

void VP8InitBitReader(VP8BitReader* const br,
                      const uint8_t* const start, size_t size) {
  assert(br != NULL);
  assert(start != NULL);
  assert(size < (1u << 31));   // limit ensured by format and upstream checks
  br->range   = 255 - 1;
  br->value   = 0;
  br->bits    = -8;   // to load the very first 8bits
  br->eof     = 0;
  VP8BitReaderSetBuffer(br, start, size);
  VP8LoadNewBytes(br);
}